

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

double dlib::string_cast_helper<double>::cast<char,std::char_traits<char>,std::allocator<char>>
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  pointer pcVar1;
  int iVar2;
  string_cast_error *psVar3;
  double temp;
  basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> sin;
  string local_1c8;
  double local_1a8;
  long local_1a0 [4];
  byte abStack_180 [88];
  ios_base local_128 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_1a0,(string *)str,_S_in);
  std::istream::_M_extract<double>((double *)local_1a0);
  if ((abStack_180[*(long *)(local_1a0[0] + -0x18)] & 5) != 0) {
    psVar3 = (string_cast_error *)__cxa_allocate_exception(0x30);
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    pcVar1 = (str->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,pcVar1,pcVar1 + str->_M_string_length);
    string_cast_error::string_cast_error(psVar3,&local_1c8);
    __cxa_throw(psVar3,&string_cast_error::typeinfo,error::~error);
  }
  iVar2 = std::istream::get();
  if (iVar2 == -1) {
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1a0);
    std::ios_base::~ios_base(local_128);
    return local_1a8;
  }
  psVar3 = (string_cast_error *)__cxa_allocate_exception(0x30);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar1,pcVar1 + str->_M_string_length);
  string_cast_error::string_cast_error(psVar3,&local_1c8);
  __cxa_throw(psVar3,&string_cast_error::typeinfo,error::~error);
}

Assistant:

static const T cast (
            const std::basic_string<charT,traits,alloc>& str
        )
        {
            using namespace std;
            basic_istringstream<charT,traits,alloc> sin(str);
            T temp;
            sin >> temp;
            if (!sin) throw string_cast_error(narrow(str));
            if (sin.get() != std::char_traits<charT>::eof()) throw string_cast_error(narrow(str));   
            return temp;
        }